

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O0

TransactionError node::HandleATMPError(TxValidationState *state,string *err_string_out)

{
  bool bVar1;
  TxValidationResult TVar2;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000018;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 local_2c;
  ValidationState<TxValidationResult> *this;
  
  this = *(ValidationState<TxValidationResult> **)(in_FS_OFFSET + 0x28);
  ValidationState<TxValidationResult>::ToString_abi_cxx11_(this);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_00000018,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)state);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  bVar1 = ValidationState<TxValidationResult>::IsInvalid
                    ((ValidationState<TxValidationResult> *)
                     CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (bVar1) {
    TVar2 = ValidationState<TxValidationResult>::GetResult
                      ((ValidationState<TxValidationResult> *)
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (TVar2 == TX_MISSING_INPUTS) {
      local_2c = MISSING_INPUTS;
    }
    else {
      local_2c = MEMPOOL_REJECTED;
    }
  }
  else {
    local_2c = MEMPOOL_ERROR;
  }
  if (*(ValidationState<TxValidationResult> **)(in_FS_OFFSET + 0x28) == this) {
    return local_2c;
  }
  __stack_chk_fail();
}

Assistant:

static TransactionError HandleATMPError(const TxValidationState& state, std::string& err_string_out)
{
    err_string_out = state.ToString();
    if (state.IsInvalid()) {
        if (state.GetResult() == TxValidationResult::TX_MISSING_INPUTS) {
            return TransactionError::MISSING_INPUTS;
        }
        return TransactionError::MEMPOOL_REJECTED;
    } else {
        return TransactionError::MEMPOOL_ERROR;
    }
}